

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database_unittest.cc
# Opt level: O0

void google::protobuf::anon_unknown_0::AddToDatabase
               (SimpleDescriptorDatabase *database,char *file_text)

{
  bool bVar1;
  char *message;
  Message *in_RCX;
  char *in_R9;
  string_view input;
  string local_178;
  AssertHelper local_158;
  Message local_150 [3];
  basic_string_view<char,_std::char_traits<char>_> local_138;
  bool local_121;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_;
  FileDescriptorProto file_proto;
  char *file_text_local;
  SimpleDescriptorDatabase *database_local;
  
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&gtest_ar_.message_);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_138,file_text);
  input._M_str = (char *)&gtest_ar_.message_;
  input._M_len = (size_t)local_138._M_str;
  local_121 = TextFormat::ParseFromString((TextFormat *)local_138._M_len,input,in_RCX);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_120,&local_121,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(local_150);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_178,(internal *)local_120,
               (AssertionResult *)"TextFormat::ParseFromString(file_text, &file_proto)","false",
               "true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x22,message);
    testing::internal::AssertHelper::operator=(&local_158,local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    std::__cxx11::string::~string((string *)&local_178);
    testing::Message::~Message(local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  SimpleDescriptorDatabase::Add(database,(FileDescriptorProto *)&gtest_ar_.message_);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&gtest_ar_.message_);
  return;
}

Assistant:

static void AddToDatabase(SimpleDescriptorDatabase* database,
                          const char* file_text) {
  FileDescriptorProto file_proto;
  EXPECT_TRUE(TextFormat::ParseFromString(file_text, &file_proto));
  database->Add(file_proto);
}